

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::SharedBasicVarCase::init(SharedBasicVarCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  uint uVar1;
  int iVar2;
  char *__s;
  ostream *poVar3;
  size_t sVar4;
  ShaderProgram *pSVar5;
  TestError *this_00;
  long lVar6;
  uint uVar7;
  bool *__s_00;
  ostringstream src;
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  uint local_2a0;
  value_type local_298;
  undefined1 local_278 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1e8;
  undefined1 local_1c8 [32];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar1 = (this->m_workGroupSize).m_data[0];
  lVar6 = 0;
  do {
    uVar1 = uVar1 * (this->m_workGroupSize).m_data[lVar6 + 1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  uVar7 = 0xf;
  if ((int)uVar1 < 0xf) {
    uVar7 = uVar1;
  }
  if (this->m_precision == PRECISION_LAST) {
    __s_00 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  else {
    __s_00 = (bool *)glu::getPrecisionName(this->m_precision);
  }
  __s = glu::getDataTypeName(this->m_basicType);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", local_size_y = ",0x11);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", local_size_z = ",0x11);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "const uint LOCAL_SIZE = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"shared ",7);
  iVar2 = (int)poVar3;
  if (__s_00 == (bool *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s_00,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," s_var;\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"uniform ",8);
  if (__s_00 == (bool *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s_00,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," u_val[",7);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"uniform ",8);
  if (__s_00 == (bool *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s_00,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," u_ref[",7);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"uniform uint u_numIters;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"layout(binding = 0) buffer Result\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tbool isOk[LOCAL_SIZE];\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tbool allOk = true;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tfor (uint ndx = 0u; ndx < u_numIters; ndx++)\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\t\tif (ndx == gl_LocalInvocationIndex)\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\t\t\ts_var = u_val[ndx%uint(u_val.length())];\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t\tbarrier();\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\t\tif (s_var != u_ref[ndx%uint(u_ref.length())])\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t\t\tallOk = false;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t\tbarrier();\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tisOk[gl_LocalInvocationIndex] = allOk;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1c8[0x10] = 0;
  local_1c8._17_8_ = 0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8[8] = 0;
  local_1c8._9_7_ = 0;
  memset(local_278,0,0xac);
  std::__cxx11::stringbuf::str();
  local_2a0 = 5;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_2c0,local_2b8 + (long)local_2c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + (ulong)local_2a0 * 0x18),&local_298);
  glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx,(ProgramSources *)local_278);
  this->m_program = pSVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0,local_2b0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1e8);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  pSVar5 = this->m_program;
  if ((pSVar5->m_program).m_info.linkOk != false) {
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    iVar2 = std::ios_base::~ios_base(local_138);
    return iVar2;
  }
  if (pSVar5 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar5);
    operator_delete(pSVar5,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Compile failed","");
  tcu::TestError::TestError(this_00,(string *)local_278);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SharedBasicVarCase::init (void)
{
	const int			valArrayLength	= de::min<int>(MAX_VALUE_ARRAY_LENGTH, product(m_workGroupSize));
	const char*			precName		= m_precision != glu::PRECISION_LAST ? getPrecisionName(m_precision) : "";
	const char*			typeName		= getDataTypeName(m_basicType);
	std::ostringstream	src;

	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_workGroupSize[0]
		<< ", local_size_y = " << m_workGroupSize[1]
		<< ", local_size_z = " << m_workGroupSize[2]
		<< ") in;\n"
		<< "const uint LOCAL_SIZE = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "shared " << precName << " " << typeName << " s_var;\n"
		<< "uniform " << precName << " " << typeName << " u_val[" << valArrayLength << "];\n"
		<< "uniform " << precName << " " << typeName << " u_ref[" << valArrayLength << "];\n"
		<< "uniform uint u_numIters;\n"
		<< "layout(binding = 0) buffer Result\n"
		<< "{\n"
		<< "	bool isOk[LOCAL_SIZE];\n"
		<< "};\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	bool allOk = true;\n"
		<< "	for (uint ndx = 0u; ndx < u_numIters; ndx++)\n"
		<< "	{\n"
		<< "		if (ndx == gl_LocalInvocationIndex)\n"
		<< "			s_var = u_val[ndx%uint(u_val.length())];\n"
		<< "\n"
		<< "		barrier();\n"
		<< "\n"
		<< "		if (s_var != u_ref[ndx%uint(u_ref.length())])\n"
		<< "			allOk = false;\n"
		<< "\n"
		<< "		barrier();\n"
		<< "	}\n"
		<< "\n"
		<< "	isOk[gl_LocalInvocationIndex] = allOk;\n"
		<< "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}